

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprVectorSize(Expr *pExpr)

{
  u8 op;
  Expr *pExpr_local;
  int local_4;
  
  op = pExpr->op;
  if (op == 0xb0) {
    op = pExpr->op2;
  }
  if (op == 0xb1) {
    local_4 = ((pExpr->x).pList)->nExpr;
  }
  else if (op == 0x8b) {
    local_4 = ((pExpr->x).pSelect)->pEList->nExpr;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprVectorSize(const Expr *pExpr){
  u8 op = pExpr->op;
  if( op==TK_REGISTER ) op = pExpr->op2;
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pExpr) );
    return pExpr->x.pList->nExpr;
  }else if( op==TK_SELECT ){
    assert( ExprUseXSelect(pExpr) );
    return pExpr->x.pSelect->pEList->nExpr;
  }else{
    return 1;
  }
}